

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smemory.c
# Opt level: O0

float * floatCalloc(size_t n)

{
  float *pfVar1;
  char local_128 [8];
  char msg [256];
  ulong uStack_20;
  float zero;
  size_t i;
  float *buf;
  size_t n_local;
  
  msg[0xfc] = '\0';
  msg[0xfd] = '\0';
  msg[0xfe] = '\0';
  msg[0xff] = '\0';
  pfVar1 = (float *)superlu_malloc(n << 2);
  if (pfVar1 == (float *)0x0) {
    sprintf(local_128,"%s at line %d in file %s\n",
            "SUPERLU_MALLOC failed for buf in floatCalloc()\n",0x2c2,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/smemory.c");
    superlu_abort_and_exit(local_128);
  }
  for (uStack_20 = 0; uStack_20 < n; uStack_20 = uStack_20 + 1) {
    pfVar1[uStack_20] = (float)msg._252_4_;
  }
  return pfVar1;
}

Assistant:

float *floatCalloc(size_t n)
{
    float *buf;
    register size_t i;
    float zero = 0.0;
    buf = (float *) SUPERLU_MALLOC(n * (size_t) sizeof(float));
    if ( !buf ) {
	ABORT("SUPERLU_MALLOC failed for buf in floatCalloc()\n");
    }
    for (i = 0; i < n; ++i) buf[i] = zero;
    return (buf);
}